

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O1

void RegexTree::generate_followpos(StateMap *mp,FollowPos *fp,tree_node *ptr)

{
  iterator __position;
  __node_base _Var1;
  mapped_type *pmVar2;
  StateSet *s;
  _Hash_node_base *p_Var3;
  vector<int,std::allocator<int>> *this;
  tree_node *q;
  tree_node *p;
  StateSet c2;
  StateSet c1;
  key_type local_b0;
  key_type local_a8;
  undefined1 local_a0 [56];
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if (ptr->left == (tree_node *)0x0) {
    if (ptr->right == (tree_node *)0x0) {
      return;
    }
  }
  else {
    generate_followpos(mp,fp,ptr->left);
  }
  if (ptr->right != (tree_node *)0x0) {
    generate_followpos(mp,fp,ptr->right);
  }
  if ((ptr->c & 0xfeU) == 8) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_a0._0_8_ = local_a0 + 0x30;
    local_a0._8_8_ = (tree_node *)0x1;
    local_a0._16_8_ = (_Hash_node_base *)0x0;
    local_a0._24_8_ = 0;
    local_a0._32_4_ = 1.0;
    local_a0._40_8_ = 0;
    local_a0._48_8_ = (__node_base_ptr)0x0;
    lastpos(ptr->left,(StateSet *)&local_68);
    firstpos((RegexTree *)(&ptr->left)[ptr->c == '\b'],(tree_node *)local_a0,s);
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var1._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        local_a8 = (key_type)_Var1._M_nxt[1]._M_nxt;
        for (p_Var3 = (_Hash_node_base *)local_a0._16_8_; p_Var3 != (_Hash_node_base *)0x0;
            p_Var3 = p_Var3->_M_nxt) {
          local_b0 = (key_type)p_Var3[1]._M_nxt;
          pmVar2 = std::__detail::
                   _Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)mp,&local_a8);
          this = (vector<int,std::allocator<int>> *)
                 ((fp->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + *pmVar2);
          pmVar2 = std::__detail::
                   _Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)mp,&local_b0);
          __position._M_current = *(int **)(this + 8);
          if (__position._M_current == *(int **)(this + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this,__position,pmVar2);
          }
          else {
            *__position._M_current = *pmVar2;
            *(int **)(this + 8) = __position._M_current + 1;
          }
        }
        _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt;
      } while (_Var1._M_nxt != (_Hash_node_base *)0x0);
    }
    std::
    _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_a0);
    std::
    _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return;
}

Assistant:

void RegexTree::generate_followpos(const RegexTree::StateMap &mp,
                                   RegexTree::FollowPos &fp, const tree_node *ptr) {
    if (no_child(ptr)) return;
    if (ptr->left != nullptr)
        generate_followpos(mp, fp, ptr->left);
    if (ptr->right != nullptr)
        generate_followpos(mp, fp, ptr->right);
    if (ptr->c == CAT || ptr->c == STAR) {
        StateSet c1, c2;
        lastpos(ptr->left, c1);
        if (ptr->c == CAT)
            firstpos(ptr->right, c2);
        else
            firstpos(ptr->left, c2);
        for (const tree_node *p : c1) {
            for (const tree_node *q : c2)
                fp[mp.at(p)].push_back(mp.at(q));
        }
    }
}